

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetRGBA(GPU_Image *image,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  if (image != (GPU_Image *)0x0) {
    (image->color).r = r;
    (image->color).g = g;
    (image->color).b = b;
    (image->color).a = a;
  }
  return;
}

Assistant:

void GPU_SetRGBA(GPU_Image* image, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    SDL_Color c;
    c.r = r;
    c.g = g;
    c.b = b;
    GET_ALPHA(c) = a;

    if(image == NULL)
        return;

    image->color = c;
}